

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O1

Font __thiscall lunasvg::SVGLayoutState::font(SVGLayoutState *this)

{
  char cVar1;
  undefined1 uVar2;
  FontFace this_00;
  void *pvVar3;
  string_view *psVar4;
  _Base_ptr in_RSI;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  size_type __n;
  _Base_ptr __n_00;
  undefined8 extraout_XMM0_Qa;
  Font FVar7;
  FontFace face;
  basic_string_view<char,_std::char_traits<char>_> family;
  FontFace local_60;
  FontFace local_58;
  string_view local_50;
  _Base_ptr local_40;
  FontFace local_38;
  
  cVar1 = *(char *)((long)&in_RSI[5]._M_right + 4);
  local_60.m_face = (plutovg_font_face_t *)0x0;
  __n_00 = in_RSI[0xb]._M_left;
  local_40 = in_RSI;
  local_38.m_face = (plutovg_font_face_t *)this;
  if (__n_00 != (_Base_ptr)0x0) {
    p_Var5 = in_RSI[0xb]._M_parent;
    do {
      pvVar3 = memchr(p_Var5,0x2c,(size_t)__n_00);
      local_50._M_len = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)p_Var5;
      if (__n_00 < local_50._M_len) {
        local_50._M_len = (size_t)__n_00;
      }
      p_Var6 = (_Base_ptr)((long)&((_Base_ptr)local_50._M_len)->_M_color + (long)&p_Var5->_M_color);
      __n_00 = (_Base_ptr)((long)__n_00 - local_50._M_len);
      if ((__n_00 != (_Base_ptr)0x0) && ((char)p_Var6->_M_color == 0x2c)) {
        p_Var6 = (_Base_ptr)((long)&p_Var6->_M_color + 1);
        __n_00 = (_Base_ptr)((long)&__n_00[-1]._M_right + 7);
      }
      local_50._M_str = (char *)p_Var5;
      stripLeadingAndTrailingSpaces(&local_50);
      if ((_Base_ptr)local_50._M_len != (_Base_ptr)0x0) {
        uVar2 = (undefined1)*(_Rb_tree_color *)local_50._M_str;
        if ((uVar2 == 0x27) || (uVar2 == 0x22)) {
          p_Var5 = (_Base_ptr)((long)&((_Base_ptr)(local_50._M_len + -0x20))->_M_right + 7);
          if ((p_Var5 != (_Base_ptr)0x0) &&
             (((undefined1 *)((long)&((_Base_ptr)((long)local_50._M_str + -0x20))->_M_right + 7))
              [local_50._M_len] == uVar2)) {
            p_Var5 = (_Base_ptr)((long)&((_Base_ptr)(local_50._M_len + -0x20))->_M_right + 6);
          }
          local_50._M_len = (size_t)p_Var5;
          local_50._M_str = (char *)((long)(_Rb_tree_color *)local_50._M_str + 1);
          stripLeadingAndTrailingSpaces(&local_50);
        }
      }
      psVar4 = (string_view *)fontFaceCache();
      FontFaceCache::getFontFace
                ((FontFaceCache *)&local_58,psVar4,SUB81(&local_50,0),cVar1 == '\x01');
      FontFace::operator=(&local_60,&local_58);
      FontFace::~FontFace(&local_58);
    } while ((__n_00 != (_Base_ptr)0x0) &&
            (p_Var5 = p_Var6, local_60.m_face == (plutovg_font_face_t *)0x0));
  }
  this_00.m_face = local_38.m_face;
  if (local_60.m_face == (plutovg_font_face_t *)0x0) {
    psVar4 = (string_view *)fontFaceCache();
    local_50._M_len = (size_t)DAT_0015c388;
    local_50._M_str = (char *)emptyString_abi_cxx11_;
    FontFaceCache::getFontFace((FontFaceCache *)&local_58,psVar4,SUB81(&local_50,0),cVar1 == '\x01')
    ;
    FontFace::operator=(&local_60,&local_58);
    FontFace::~FontFace(&local_58);
  }
  Font::Font((Font *)this_00.m_face,&local_60,*(float *)((long)&local_40[3]._M_right + 4));
  FontFace::~FontFace(&local_60);
  FVar7._8_8_ = extraout_XMM0_Qa;
  FVar7.m_face.m_face = this_00.m_face;
  return FVar7;
}

Assistant:

Font SVGLayoutState::font() const
{
    auto bold = m_font_weight == FontWeight::Bold;
    auto italic = m_font_style == FontStyle::Italic;

    FontFace face;
    std::string_view input(m_font_family);
    while(!input.empty() && face.isNull()) {
        auto family = input.substr(0, input.find(','));
        input.remove_prefix(family.length());
        if(!input.empty() && input.front() == ',')
            input.remove_prefix(1);
        stripLeadingAndTrailingSpaces(family);
        if(!family.empty() && (family.front() == '\'' || family.front() == '"')) {
            auto quote = family.front();
            family.remove_prefix(1);
            if(!family.empty() && family.back() == quote)
                family.remove_suffix(1);
            stripLeadingAndTrailingSpaces(family);
        }

        face = fontFaceCache()->getFontFace(family, bold, italic);
    }

    if(face.isNull())
        face = fontFaceCache()->getFontFace(emptyString, bold, italic);
    return Font(face, m_font_size);
}